

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicatevisitor.cpp
# Opt level: O2

void __thiscall
PredicateVisitor::visit(PredicateVisitor *this,Expression *parent,VariableExpression *expression)

{
  bool bVar1;
  
  bVar1 = std::function<bool_(Expression_*)>::operator()
                    (&this->mPredicate,&expression->super_Expression);
  if (bVar1) {
    this->mHasResult = true;
  }
  return;
}

Assistant:

void PredicateVisitor::visit(Expression* parent, VariableExpression* expression) {
	if (mPredicate(expression)) {
		mHasResult = true;
	}
}